

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildFile.cpp
# Opt level: O2

Node * __thiscall
anon_unknown.dwarf_10ea85::BuildFileImpl::getOrCreateNode
          (BuildFileImpl *this,StringRef name,bool isImplicit)

{
  Node *pNVar1;
  _Head_base<0UL,_llbuild::buildsystem::Node_*,_false> _Var2;
  iterator iVar3;
  unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_> *puVar4;
  _Head_base<0UL,_llbuild::buildsystem::Node_*,_false> _Var5;
  _Head_base<0UL,_llbuild::buildsystem::Node_*,_false> local_30;
  
  iVar3 = llvm::
          StringMap<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>,_llvm::MallocAllocator>
          ::find(&this->nodes,name);
  if (iVar3.
      super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>_>
      .Ptr == (StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>_>
               )((this->nodes).super_StringMapImpl.TheTable +
                (this->nodes).super_StringMapImpl.NumBuckets)) {
    (*this->delegate->_vptr_BuildFileDelegate[0xc])
              (&local_30,this->delegate,name.Data,name.Length,(ulong)isImplicit);
    _Var5._M_head_impl = local_30._M_head_impl;
    if (local_30._M_head_impl == (Node *)0x0) {
      __assert_fail("node",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildFile.cpp"
                    ,0x174,
                    "Node *(anonymous namespace)::BuildFileImpl::getOrCreateNode(StringRef, bool)");
    }
    puVar4 = llvm::
             StringMap<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>,_llvm::MallocAllocator>
             ::operator[](&this->nodes,name);
    _Var2._M_head_impl = local_30._M_head_impl;
    local_30._M_head_impl = (Node *)0x0;
    pNVar1 = (puVar4->_M_t).
             super___uniq_ptr_impl<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>
             ._M_t.
             super__Tuple_impl<0UL,_llbuild::buildsystem::Node_*,_std::default_delete<llbuild::buildsystem::Node>_>
             .super__Head_base<0UL,_llbuild::buildsystem::Node_*,_false>._M_head_impl;
    (puVar4->_M_t).
    super___uniq_ptr_impl<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>
    ._M_t.
    super__Tuple_impl<0UL,_llbuild::buildsystem::Node_*,_std::default_delete<llbuild::buildsystem::Node>_>
    .super__Head_base<0UL,_llbuild::buildsystem::Node_*,_false>._M_head_impl = _Var2._M_head_impl;
    if (pNVar1 != (Node *)0x0) {
      (*pNVar1->_vptr_Node[1])();
    }
    if (local_30._M_head_impl != (Node *)0x0) {
      (*(local_30._M_head_impl)->_vptr_Node[1])();
    }
  }
  else {
    _Var5._M_head_impl =
         *(Node **)(*(long *)iVar3.
                             super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>_>
                             .Ptr + 8);
  }
  return _Var5._M_head_impl;
}

Assistant:

Node* getOrCreateNode(StringRef name, bool isImplicit) {
    // First, check the map.
    auto it = nodes.find(name);
    if (it != nodes.end())
      return it->second.get();
    
    // Otherwise, ask the delegate to create the node.
    auto node = delegate.createNode(name, isImplicit);
    assert(node);
    auto result = node.get();
    nodes[name] = std::move(node);

    return result;
  }